

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::ProgramInputOutputReferencedByCase::init
          (ProgramInputOutputReferencedByCase *this,EVP_PKEY_CTX *ctx)

{
  Storage SVar1;
  undefined8 uVar2;
  bool bVar3;
  ContextType type;
  GLSLVersion version;
  int extraout_EAX;
  RenderContext *pRVar4;
  ContextInfo *pCVar5;
  NotSupportedError *pNVar6;
  Program *this_00;
  char *pcVar7;
  Shader *pSVar8;
  DefaultBlock *pDVar9;
  undefined7 extraout_var;
  bool bVar10;
  bool local_9ce;
  bool local_9cd;
  int local_9cc;
  int local_9c8;
  int local_9c4;
  int local_9c0;
  bool local_971;
  bool local_961;
  Layout local_960;
  allocator<char> local_949;
  string local_948;
  VarType local_928;
  VariableDeclaration local_910;
  Layout local_8b0;
  allocator<char> local_899;
  string local_898;
  VarType local_878;
  VarType local_860;
  VariableDeclaration local_848;
  Shader *local_7e8;
  Shader *geometry;
  allocator<char> local_7c9;
  string local_7c8;
  VarType local_7a8;
  VariableDeclaration local_790;
  Layout local_730;
  allocator<char> local_719;
  string local_718;
  VarType local_6f8;
  VarType local_6e0;
  VariableDeclaration local_6c8;
  Layout local_668;
  allocator<char> local_651;
  string local_650;
  VarType local_630;
  VarType local_618;
  VariableDeclaration local_600;
  Layout local_5a0;
  allocator<char> local_589;
  string local_588;
  VarType local_568;
  VarType local_550;
  VariableDeclaration local_538;
  Shader *local_4d8;
  Shader *tessEval;
  Shader *tessCtrl;
  allocator<char> local_4b1;
  string local_4b0;
  VarType local_490;
  VariableDeclaration local_478;
  Layout local_418;
  allocator<char> local_401;
  string local_400;
  VarType local_3e0;
  VariableDeclaration local_3c8;
  Layout local_368;
  allocator<char> local_351;
  string local_350;
  VarType local_330;
  VariableDeclaration local_318;
  Layout local_2b8;
  allocator<char> local_2a1;
  string local_2a0;
  VarType local_280;
  VariableDeclaration local_268;
  Shader *local_208;
  Shader *fragment;
  Shader *vertex;
  allocator<char> local_1e1;
  string local_1e0;
  VarType local_1c0;
  undefined1 local_1a8 [8];
  VariableDeclaration targetDeclArr;
  undefined1 local_140 [3];
  bool arrayedInterface;
  ShaderType shaderType;
  allocator<char> local_129;
  string local_128;
  VarType local_108;
  undefined1 local_f0 [8];
  VariableDeclaration targetDecl;
  char *varName;
  bool perPatchStorage;
  bool isInputCase;
  allocator<char> local_79;
  GLSLVersion glslVersion;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  deUint32 local_1c;
  ContextType local_18;
  byte local_13;
  bool local_12;
  bool local_11;
  bool supportsES32;
  bool hasGeometryShader;
  ProgramInputOutputReferencedByCase *pPStack_10;
  bool hasTessellationShader;
  ProgramInputOutputReferencedByCase *this_local;
  
  local_961 = true;
  if (((this->m_caseType != CASE_VERTEX_TESS_FRAGMENT) &&
      (local_961 = true, this->m_caseType != CASE_VERTEX_TESS_GEO_FRAGMENT)) &&
     (local_961 = true, this->m_caseType != CASE_SEPARABLE_TESS_CTRL)) {
    local_961 = this->m_caseType == CASE_SEPARABLE_TESS_EVAL;
  }
  local_11 = local_961;
  local_971 = true;
  if ((this->m_caseType != CASE_VERTEX_GEO_FRAGMENT) &&
     (local_971 = true, this->m_caseType != CASE_VERTEX_TESS_GEO_FRAGMENT)) {
    local_971 = this->m_caseType == CASE_SEPARABLE_GEOMETRY;
  }
  local_12 = local_971;
  pPStack_10 = this;
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  local_18.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  local_1c = (deUint32)glu::ApiType::es(3,2);
  local_13 = glu::contextSupports(local_18,(ApiType)local_1c);
  if (((local_11 & 1U) != 0) && (!(bool)local_13)) {
    pCVar5 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar3 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_EXT_tessellation_shader");
    if (!bVar3) {
      local_55 = 1;
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Test requires GL_EXT_tessellation_shader extension",&local_41)
      ;
      tcu::NotSupportedError::NotSupportedError(pNVar6,&local_40);
      local_55 = 0;
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  if (((local_12 & 1U) != 0) && ((local_13 & 1) == 0)) {
    pCVar5 = Context::getContextInfo((this->super_TestCase).m_context);
    bVar3 = glu::ContextInfo::isExtensionSupported(pCVar5,"GL_EXT_geometry_shader");
    if (!bVar3) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&glslVersion,"Test requires GL_EXT_geometry_shader extension",&local_79);
      tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)&glslVersion);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
  }
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  type.super_ApiType.m_bits = (ApiType)(*pRVar4->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  this_00 = (Program *)operator_new(0x48);
  ProgramInterfaceDefinition::Program::Program(this_00);
  this->m_program = this_00;
  if ((((this->m_caseType == CASE_SEPARABLE_VERTEX) || (this->m_caseType == CASE_SEPARABLE_FRAGMENT)
       ) || (this->m_caseType == CASE_SEPARABLE_GEOMETRY)) ||
     ((this->m_caseType == CASE_SEPARABLE_TESS_CTRL ||
      (this->m_caseType == CASE_SEPARABLE_TESS_EVAL)))) {
    bVar3 = true;
    if (this->m_targetStorage != STORAGE_IN) {
      bVar3 = this->m_targetStorage == STORAGE_PATCH_IN;
    }
    bVar10 = true;
    if (this->m_targetStorage != STORAGE_PATCH_IN) {
      bVar10 = this->m_targetStorage == STORAGE_PATCH_OUT;
    }
    pcVar7 = "shaderOutput";
    if (bVar3) {
      pcVar7 = "shaderInput";
    }
    targetDecl.name.field_2._8_8_ = pcVar7;
    glu::VarType::VarType(&local_108,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    uVar2 = targetDecl.name.field_2._8_8_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,(char *)uVar2,&local_129);
    SVar1 = this->m_targetStorage;
    glu::Layout::Layout((Layout *)local_140,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              ((VariableDeclaration *)local_f0,&local_108,&local_128,SVar1,INTERPOLATION_LAST,
               (Layout *)local_140,0);
    std::__cxx11::string::~string((string *)&local_128);
    std::allocator<char>::~allocator(&local_129);
    glu::VarType::~VarType(&local_108);
    if (this->m_caseType == CASE_SEPARABLE_VERTEX) {
      local_9c0 = 0;
    }
    else {
      if (this->m_caseType == CASE_SEPARABLE_FRAGMENT) {
        local_9c4 = 1;
      }
      else {
        if (this->m_caseType == CASE_SEPARABLE_GEOMETRY) {
          local_9c8 = 2;
        }
        else {
          if (this->m_caseType == CASE_SEPARABLE_TESS_CTRL) {
            local_9cc = 3;
          }
          else {
            local_9cc = 6;
            if (this->m_caseType == CASE_SEPARABLE_TESS_EVAL) {
              local_9cc = 4;
            }
          }
          local_9c8 = local_9cc;
        }
        local_9c4 = local_9c8;
      }
      local_9c0 = local_9c4;
    }
    targetDeclArr.name.field_2._12_4_ = local_9c0;
    if (bVar3) {
      local_9cd = true;
      if ((local_9c0 != 2) && (local_9cd = true, local_9c0 != 3)) {
        local_9cd = local_9c0 == 4;
      }
      local_9ce = local_9cd;
    }
    else {
      local_9ce = local_9c0 == 3;
    }
    targetDeclArr.name.field_2._M_local_buf[0xb] = local_9ce;
    ProgramInterfaceDefinition::Program::setSeparable(this->m_program,true);
    if (((targetDeclArr.name.field_2._M_local_buf[0xb] & 1U) == 0) || (bVar10)) {
      pSVar8 = ProgramInterfaceDefinition::Program::addShader
                         (this->m_program,targetDeclArr.name.field_2._12_4_,version);
      pDVar9 = ProgramInterfaceDefinition::Shader::getDefaultBlock(pSVar8);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
                (&pDVar9->variables,(value_type *)local_f0);
    }
    else {
      glu::VarType::VarType(&local_1c0,(VarType *)&targetDecl.storage,-1);
      uVar2 = targetDecl.name.field_2._8_8_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1e0,(char *)uVar2,&local_1e1);
      SVar1 = this->m_targetStorage;
      glu::Layout::Layout((Layout *)&vertex,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                ((VariableDeclaration *)local_1a8,&local_1c0,&local_1e0,SVar1,INTERPOLATION_LAST,
                 (Layout *)&vertex,0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::allocator<char>::~allocator(&local_1e1);
      glu::VarType::~VarType(&local_1c0);
      pSVar8 = ProgramInterfaceDefinition::Program::addShader
                         (this->m_program,targetDeclArr.name.field_2._12_4_,version);
      pDVar9 = ProgramInterfaceDefinition::Shader::getDefaultBlock(pSVar8);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
                (&pDVar9->variables,(value_type *)local_1a8);
      glu::VariableDeclaration::~VariableDeclaration((VariableDeclaration *)local_1a8);
    }
    glu::VariableDeclaration::~VariableDeclaration((VariableDeclaration *)local_f0);
  }
  else if ((((this->m_caseType == CASE_VERTEX_FRAGMENT) ||
            (this->m_caseType == CASE_VERTEX_GEO_FRAGMENT)) ||
           (this->m_caseType == CASE_VERTEX_TESS_FRAGMENT)) ||
          (this->m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)) {
    fragment = ProgramInterfaceDefinition::Program::addShader
                         (this->m_program,SHADERTYPE_VERTEX,version);
    local_208 = ProgramInterfaceDefinition::Program::addShader
                          (this->m_program,SHADERTYPE_FRAGMENT,version);
    ProgramInterfaceDefinition::Program::setSeparable(this->m_program,false);
    pDVar9 = ProgramInterfaceDefinition::Shader::getDefaultBlock(fragment);
    glu::VarType::VarType(&local_280,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"shaderInput",&local_2a1);
    glu::Layout::Layout(&local_2b8,-1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_268,&local_280,&local_2a0,STORAGE_IN,INTERPOLATION_LAST,&local_2b8,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
              (&pDVar9->variables,&local_268);
    glu::VariableDeclaration::~VariableDeclaration(&local_268);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::allocator<char>::~allocator(&local_2a1);
    glu::VarType::~VarType(&local_280);
    pDVar9 = ProgramInterfaceDefinition::Shader::getDefaultBlock(fragment);
    glu::VarType::VarType(&local_330,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_350,"shaderOutput",&local_351);
    glu::Layout::Layout(&local_368,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_318,&local_330,&local_350,STORAGE_OUT,INTERPOLATION_LAST,&local_368,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
              (&pDVar9->variables,&local_318);
    glu::VariableDeclaration::~VariableDeclaration(&local_318);
    std::__cxx11::string::~string((string *)&local_350);
    std::allocator<char>::~allocator(&local_351);
    glu::VarType::~VarType(&local_330);
    pDVar9 = ProgramInterfaceDefinition::Shader::getDefaultBlock(local_208);
    glu::VarType::VarType(&local_3e0,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_400,"shaderOutput",&local_401);
    glu::Layout::Layout(&local_418,0,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_3c8,&local_3e0,&local_400,STORAGE_OUT,INTERPOLATION_LAST,&local_418,0);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
              (&pDVar9->variables,&local_3c8);
    glu::VariableDeclaration::~VariableDeclaration(&local_3c8);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    glu::VarType::~VarType(&local_3e0);
    pDVar9 = ProgramInterfaceDefinition::Shader::getDefaultBlock(local_208);
    glu::VarType::VarType(&local_490,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4b0,"shaderInput",&local_4b1);
    glu::Layout::Layout((Layout *)&tessCtrl,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
    glu::VariableDeclaration::VariableDeclaration
              (&local_478,&local_490,&local_4b0,STORAGE_IN,INTERPOLATION_LAST,(Layout *)&tessCtrl,0)
    ;
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
              (&pDVar9->variables,&local_478);
    glu::VariableDeclaration::~VariableDeclaration(&local_478);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::allocator<char>::~allocator(&local_4b1);
    glu::VarType::~VarType(&local_490);
    if ((this->m_caseType == CASE_VERTEX_TESS_FRAGMENT) ||
       (this->m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)) {
      tessEval = ProgramInterfaceDefinition::Program::addShader
                           (this->m_program,SHADERTYPE_TESSELLATION_CONTROL,version);
      local_4d8 = ProgramInterfaceDefinition::Program::addShader
                            (this->m_program,SHADERTYPE_TESSELLATION_EVALUATION,version);
      pDVar9 = ProgramInterfaceDefinition::Shader::getDefaultBlock(tessEval);
      glu::VarType::VarType(&local_568,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      glu::VarType::VarType(&local_550,&local_568,-1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_588,"shaderInput",&local_589);
      glu::Layout::Layout(&local_5a0,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&local_538,&local_550,&local_588,STORAGE_IN,INTERPOLATION_LAST,&local_5a0,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
                (&pDVar9->variables,&local_538);
      glu::VariableDeclaration::~VariableDeclaration(&local_538);
      std::__cxx11::string::~string((string *)&local_588);
      std::allocator<char>::~allocator(&local_589);
      glu::VarType::~VarType(&local_550);
      glu::VarType::~VarType(&local_568);
      pDVar9 = ProgramInterfaceDefinition::Shader::getDefaultBlock(tessEval);
      glu::VarType::VarType(&local_630,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      glu::VarType::VarType(&local_618,&local_630,-1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_650,"shaderOutput",&local_651);
      glu::Layout::Layout(&local_668,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&local_600,&local_618,&local_650,STORAGE_OUT,INTERPOLATION_LAST,&local_668,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
                (&pDVar9->variables,&local_600);
      glu::VariableDeclaration::~VariableDeclaration(&local_600);
      std::__cxx11::string::~string((string *)&local_650);
      std::allocator<char>::~allocator(&local_651);
      glu::VarType::~VarType(&local_618);
      glu::VarType::~VarType(&local_630);
      pDVar9 = ProgramInterfaceDefinition::Shader::getDefaultBlock(local_4d8);
      glu::VarType::VarType(&local_6f8,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      glu::VarType::VarType(&local_6e0,&local_6f8,-1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_718,"shaderInput",&local_719);
      glu::Layout::Layout(&local_730,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&local_6c8,&local_6e0,&local_718,STORAGE_IN,INTERPOLATION_LAST,&local_730,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
                (&pDVar9->variables,&local_6c8);
      glu::VariableDeclaration::~VariableDeclaration(&local_6c8);
      std::__cxx11::string::~string((string *)&local_718);
      std::allocator<char>::~allocator(&local_719);
      glu::VarType::~VarType(&local_6e0);
      glu::VarType::~VarType(&local_6f8);
      pDVar9 = ProgramInterfaceDefinition::Shader::getDefaultBlock(local_4d8);
      glu::VarType::VarType(&local_7a8,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7c8,"shaderOutput",&local_7c9);
      glu::Layout::Layout((Layout *)&geometry,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&local_790,&local_7a8,&local_7c8,STORAGE_OUT,INTERPOLATION_LAST,(Layout *)&geometry
                 ,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
                (&pDVar9->variables,&local_790);
      glu::VariableDeclaration::~VariableDeclaration(&local_790);
      std::__cxx11::string::~string((string *)&local_7c8);
      std::allocator<char>::~allocator(&local_7c9);
      glu::VarType::~VarType(&local_7a8);
    }
    if ((this->m_caseType == CASE_VERTEX_GEO_FRAGMENT) ||
       (this->m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)) {
      local_7e8 = ProgramInterfaceDefinition::Program::addShader
                            (this->m_program,SHADERTYPE_GEOMETRY,version);
      pDVar9 = ProgramInterfaceDefinition::Shader::getDefaultBlock(local_7e8);
      glu::VarType::VarType(&local_878,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      glu::VarType::VarType(&local_860,&local_878,-1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_898,"shaderInput",&local_899);
      glu::Layout::Layout(&local_8b0,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&local_848,&local_860,&local_898,STORAGE_IN,INTERPOLATION_LAST,&local_8b0,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
                (&pDVar9->variables,&local_848);
      glu::VariableDeclaration::~VariableDeclaration(&local_848);
      std::__cxx11::string::~string((string *)&local_898);
      std::allocator<char>::~allocator(&local_899);
      glu::VarType::~VarType(&local_860);
      glu::VarType::~VarType(&local_878);
      pDVar9 = ProgramInterfaceDefinition::Shader::getDefaultBlock(local_7e8);
      glu::VarType::VarType(&local_928,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_948,"shaderOutput",&local_949);
      glu::Layout::Layout(&local_960,1,-1,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      glu::VariableDeclaration::VariableDeclaration
                (&local_910,&local_928,&local_948,STORAGE_OUT,INTERPOLATION_LAST,&local_960,0);
      std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::push_back
                (&pDVar9->variables,&local_910);
      glu::VariableDeclaration::~VariableDeclaration(&local_910);
      std::__cxx11::string::~string((string *)&local_948);
      std::allocator<char>::~allocator(&local_949);
      glu::VarType::~VarType(&local_928);
    }
  }
  bVar3 = ProgramInterfaceDefinition::Program::hasStage(this->m_program,SHADERTYPE_GEOMETRY);
  if (bVar3) {
    ProgramInterfaceDefinition::Program::setGeometryNumOutputVertices(this->m_program,1);
  }
  bVar3 = ProgramInterfaceDefinition::Program::hasStage
                    (this->m_program,SHADERTYPE_TESSELLATION_CONTROL);
  if (!bVar3) {
    bVar3 = ProgramInterfaceDefinition::Program::hasStage
                      (this->m_program,SHADERTYPE_TESSELLATION_EVALUATION);
    if (!bVar3) {
      return (int)CONCAT71(extraout_var,bVar3);
    }
  }
  ProgramInterfaceDefinition::Program::setTessellationNumOutputPatchVertices(this->m_program,1);
  return extraout_EAX;
}

Assistant:

void ProgramInputOutputReferencedByCase::init (void)
{
	const bool hasTessellationShader =	(m_caseType == CASE_VERTEX_TESS_FRAGMENT)		||
										(m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)	||
										(m_caseType == CASE_SEPARABLE_TESS_CTRL)		||
										(m_caseType == CASE_SEPARABLE_TESS_EVAL);
	const bool hasGeometryShader =		(m_caseType == CASE_VERTEX_GEO_FRAGMENT)		||
										(m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)	||
										(m_caseType == CASE_SEPARABLE_GEOMETRY);
	const bool supportsES32 =			glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (hasTessellationShader && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	if (hasGeometryShader && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_geometry_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_geometry_shader extension");

	glu::GLSLVersion glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
	m_program = new ProgramInterfaceDefinition::Program();

	if (m_caseType == CASE_SEPARABLE_VERTEX		||
		m_caseType == CASE_SEPARABLE_FRAGMENT	||
		m_caseType == CASE_SEPARABLE_GEOMETRY	||
		m_caseType == CASE_SEPARABLE_TESS_CTRL	||
		m_caseType == CASE_SEPARABLE_TESS_EVAL)
	{
		const bool						isInputCase			= (m_targetStorage == glu::STORAGE_IN || m_targetStorage == glu::STORAGE_PATCH_IN);
		const bool						perPatchStorage		= (m_targetStorage == glu::STORAGE_PATCH_IN || m_targetStorage == glu::STORAGE_PATCH_OUT);
		const char*						varName				= (isInputCase) ? ("shaderInput") : ("shaderOutput");
		const glu::VariableDeclaration	targetDecl			(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), varName, m_targetStorage);
		const glu::ShaderType			shaderType			= (m_caseType == CASE_SEPARABLE_VERTEX)		? (glu::SHADERTYPE_VERTEX)
															: (m_caseType == CASE_SEPARABLE_FRAGMENT)	? (glu::SHADERTYPE_FRAGMENT)
															: (m_caseType == CASE_SEPARABLE_GEOMETRY)	? (glu::SHADERTYPE_GEOMETRY)
															: (m_caseType == CASE_SEPARABLE_TESS_CTRL)	? (glu::SHADERTYPE_TESSELLATION_CONTROL)
															: (m_caseType == CASE_SEPARABLE_TESS_EVAL)	? (glu::SHADERTYPE_TESSELLATION_EVALUATION)
															:											  (glu::SHADERTYPE_LAST);
		const bool						arrayedInterface	= (isInputCase) ? ((shaderType == glu::SHADERTYPE_GEOMETRY)					||
																			   (shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)		||
																			   (shaderType == glu::SHADERTYPE_TESSELLATION_EVALUATION))
																			: (shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL);

		m_program->setSeparable(true);

		if (arrayedInterface && !perPatchStorage)
		{
			const glu::VariableDeclaration targetDeclArr(glu::VarType(targetDecl.varType, glu::VarType::UNSIZED_ARRAY), varName, m_targetStorage);
			m_program->addShader(shaderType, glslVersion)->getDefaultBlock().variables.push_back(targetDeclArr);
		}
		else
		{
			m_program->addShader(shaderType, glslVersion)->getDefaultBlock().variables.push_back(targetDecl);
		}
	}
	else if (m_caseType == CASE_VERTEX_FRAGMENT			||
			 m_caseType == CASE_VERTEX_GEO_FRAGMENT		||
			 m_caseType == CASE_VERTEX_TESS_FRAGMENT	||
			 m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)
	{
		ProgramInterfaceDefinition::Shader*	vertex		= m_program->addShader(glu::SHADERTYPE_VERTEX, glslVersion);
		ProgramInterfaceDefinition::Shader*	fragment	= m_program->addShader(glu::SHADERTYPE_FRAGMENT, glslVersion);

		m_program->setSeparable(false);

		vertex->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																			   "shaderInput",
																			   glu::STORAGE_IN));
		vertex->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																			   "shaderOutput",
																			   glu::STORAGE_OUT,
																			   glu::INTERPOLATION_LAST,
																			   glu::Layout(1)));

		fragment->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																				 "shaderOutput",
																				 glu::STORAGE_OUT,
																				 glu::INTERPOLATION_LAST,
																				 glu::Layout(0)));
		fragment->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																				 "shaderInput",
																				 glu::STORAGE_IN,
																				 glu::INTERPOLATION_LAST,
																				 glu::Layout(1)));

		if (m_caseType == CASE_VERTEX_TESS_FRAGMENT || m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)
		{
			ProgramInterfaceDefinition::Shader* tessCtrl = m_program->addShader(glu::SHADERTYPE_TESSELLATION_CONTROL, glslVersion);
			ProgramInterfaceDefinition::Shader* tessEval = m_program->addShader(glu::SHADERTYPE_TESSELLATION_EVALUATION, glslVersion);

			tessCtrl->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY),
																					 "shaderInput",
																					 glu::STORAGE_IN,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
			tessCtrl->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY),
																					 "shaderOutput",
																					 glu::STORAGE_OUT,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));

			tessEval->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY),
																					 "shaderInput",
																					 glu::STORAGE_IN,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
			tessEval->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																					 "shaderOutput",
																					 glu::STORAGE_OUT,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
		}

		if (m_caseType == CASE_VERTEX_GEO_FRAGMENT || m_caseType == CASE_VERTEX_TESS_GEO_FRAGMENT)
		{
			ProgramInterfaceDefinition::Shader* geometry = m_program->addShader(glu::SHADERTYPE_GEOMETRY, glslVersion);

			geometry->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP), glu::VarType::UNSIZED_ARRAY),
																					 "shaderInput",
																					 glu::STORAGE_IN,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
			geometry->getDefaultBlock().variables.push_back(glu::VariableDeclaration(glu::VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP),
																					 "shaderOutput",
																					 glu::STORAGE_OUT,
																					 glu::INTERPOLATION_LAST,
																					 glu::Layout(1)));
		}
	}
	else
		DE_ASSERT(false);

	if (m_program->hasStage(glu::SHADERTYPE_GEOMETRY))
		m_program->setGeometryNumOutputVertices(1);
	if (m_program->hasStage(glu::SHADERTYPE_TESSELLATION_CONTROL) || m_program->hasStage(glu::SHADERTYPE_TESSELLATION_EVALUATION))
		m_program->setTessellationNumOutputPatchVertices(1);

	DE_ASSERT(m_program->isValid());
}